

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_tt_Rasterize(nk_tt__bitmap *result,float flatness_in_pixels,nk_tt_vertex *vertices,
                    int num_verts,float scale_x,float scale_y,float shift_x,float shift_y,int x_off,
                    int y_off,int invert,nk_allocator *alloc)

{
  nk_tt__point *pts;
  float local_5c;
  nk_tt__point *windings;
  int *winding_lengths;
  int winding_count;
  float scale;
  int invert_local;
  int y_off_local;
  int x_off_local;
  float shift_y_local;
  float shift_x_local;
  float scale_y_local;
  float scale_x_local;
  int num_verts_local;
  nk_tt_vertex *vertices_local;
  nk_tt__bitmap *pnStack_10;
  float flatness_in_pixels_local;
  nk_tt__bitmap *result_local;
  
  local_5c = scale_x;
  if (scale_y < scale_x) {
    local_5c = scale_y;
  }
  winding_lengths._4_4_ = local_5c;
  winding_count = invert;
  scale = (float)y_off;
  invert_local = x_off;
  y_off_local = (int)shift_y;
  x_off_local = (int)shift_x;
  shift_y_local = scale_y;
  shift_x_local = scale_x;
  scale_y_local = (float)num_verts;
  _scale_x_local = vertices;
  vertices_local._4_4_ = flatness_in_pixels;
  pnStack_10 = result;
  pts = nk_tt_FlattenCurves(vertices,num_verts,flatness_in_pixels / local_5c,(int **)&windings,
                            (int *)&winding_lengths,alloc);
  if (alloc == (nk_allocator *)0x0) {
    __assert_fail("alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2535,
                  "void nk_tt_Rasterize(struct nk_tt__bitmap *, float, struct nk_tt_vertex *, int, float, float, float, float, int, int, int, struct nk_allocator *)"
                 );
  }
  if (pts != (nk_tt__point *)0x0) {
    nk_tt__rasterize(pnStack_10,pts,(int *)windings,(int)winding_lengths,shift_x_local,shift_y_local
                     ,(float)x_off_local,(float)y_off_local,invert_local,(int)scale,winding_count,
                     alloc);
    (*alloc->free)(alloc->userdata,windings);
    (*alloc->free)(alloc->userdata,pts);
  }
  return;
}

Assistant:

NK_INTERN void
nk_tt_Rasterize(struct nk_tt__bitmap *result, float flatness_in_pixels,
    struct nk_tt_vertex *vertices, int num_verts,
    float scale_x, float scale_y, float shift_x, float shift_y,
    int x_off, int y_off, int invert, struct nk_allocator *alloc)
{
    float scale = scale_x > scale_y ? scale_y : scale_x;
    int winding_count, *winding_lengths;
    struct nk_tt__point *windings = nk_tt_FlattenCurves(vertices, num_verts,
        flatness_in_pixels / scale, &winding_lengths, &winding_count, alloc);

    NK_ASSERT(alloc);
    if (windings) {
        nk_tt__rasterize(result, windings, winding_lengths, winding_count,
            scale_x, scale_y, shift_x, shift_y, x_off, y_off, invert, alloc);
        alloc->free(alloc->userdata, winding_lengths);
        alloc->free(alloc->userdata, windings);
    }
}